

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::Option::run_callback(Option *this)

{
  results_t *this_00;
  bool bVar1;
  bool bVar2;
  ConversionError *this_01;
  results_t *__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_68;
  string local_48;
  
  if ((this->force_callback_ == true) &&
     ((this->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    ::std::__cxx11::string::string((string *)&local_48,(string *)&this->default_str_);
    add_result(this,&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  if (this->current_option_state_ == parsing) {
    _validate_results(this,&this->results_);
    this->current_option_state_ = validated;
  }
  else if ('\x03' < (char)this->current_option_state_) goto LAB_0012cb71;
  _reduce_results(this,&this->proc_results_,&this->results_);
LAB_0012cb71:
  this->current_option_state_ = callback_run;
  if ((this->callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    this_00 = &this->results_;
    __args = &this->proc_results_;
    if ((this->proc_results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->proc_results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __args = this_00;
    }
    bVar2 = std::
            function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
            ::operator()(&this->callback_,__args);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->proc_results_);
    }
    if (!bVar2) {
      this_01 = (ConversionError *)__cxa_allocate_exception(0x38);
      get_name_abi_cxx11_(&local_68,this,false,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_80,this_00);
      ConversionError::ConversionError(this_01,&local_68,&local_80);
      __cxa_throw(this_01,&ConversionError::typeinfo,Error::~Error);
    }
  }
  return;
}

Assistant:

CLI11_INLINE void Option::run_callback() {
    bool used_default_str = false;
    if(force_callback_ && results_.empty()) {
        used_default_str = true;
        add_result(default_str_);
    }
    if(current_option_state_ == option_state::parsing) {
        _validate_results(results_);
        current_option_state_ = option_state::validated;
    }

    if(current_option_state_ < option_state::reduced) {
        _reduce_results(proc_results_, results_);
    }

    current_option_state_ = option_state::callback_run;
    if(callback_) {
        const results_t &send_results = proc_results_.empty() ? results_ : proc_results_;
        bool local_result = callback_(send_results);
        if(used_default_str) {
            // we only clear the results if the callback was actually used
            // otherwise the callback is the storage of the default
            results_.clear();
            proc_results_.clear();
        }
        if(!local_result)
            throw ConversionError(get_name(), results_);
    }
}